

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O0

void pack_free(t_pack *x)

{
  int local_1c;
  t_gpointer *ptStack_18;
  int i;
  t_gpointer *gp;
  t_pack *x_local;
  
  ptStack_18 = x->x_gpointer;
  local_1c = (int)x->x_nptr;
  while (local_1c != 0) {
    gpointer_unset(ptStack_18);
    ptStack_18 = ptStack_18 + 1;
    local_1c = local_1c + -1;
  }
  freebytes(x->x_vec,x->x_n << 4);
  freebytes(x->x_outvec,x->x_n << 4);
  freebytes(x->x_gpointer,x->x_nptr * 0x18);
  return;
}

Assistant:

static void pack_free(t_pack *x)
{
    t_gpointer *gp;
    int i;
    for (gp = x->x_gpointer, i = (int)x->x_nptr; i--; gp++)
        gpointer_unset(gp);
    freebytes(x->x_vec, x->x_n * sizeof(*x->x_vec));
    freebytes(x->x_outvec, x->x_n * sizeof(*x->x_outvec));
    freebytes(x->x_gpointer, x->x_nptr * sizeof(*x->x_gpointer));
}